

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackLog.cxx
# Opt level: O3

bool __thiscall cmCPackLog::SetLogOutputFile(cmCPackLog *this,char *fname)

{
  _func_int **pp_Var1;
  cmGeneratedFileStream *this_00;
  
  if (fname != (char *)0x0) {
    this_00 = (cmGeneratedFileStream *)operator_new(0x248);
    cmGeneratedFileStream::cmGeneratedFileStream(this_00,fname,false);
    pp_Var1 = (this_00->super_ofstream).super_basic_ostream<char,_std::char_traits<char>_>.
              _vptr_basic_ostream;
    if (((&(this_00->super_ofstream).super_basic_ostream<char,_std::char_traits<char>_>.field_0x20)
         [(long)pp_Var1[-3]] & 5) == 0) goto LAB_00248224;
    (*pp_Var1[1])(this_00);
  }
  this_00 = (cmGeneratedFileStream *)0x0;
LAB_00248224:
  if ((this->LogOutputCleanup == true) && (this->LogOutput != (ostream *)0x0)) {
    (*this->LogOutput->_vptr_basic_ostream[1])();
  }
  this->LogOutputCleanup = false;
  this->LogOutput = (ostream *)this_00;
  if (this_00 != (cmGeneratedFileStream *)0x0) {
    this->LogOutputCleanup = true;
  }
  return this_00 != (cmGeneratedFileStream *)0x0;
}

Assistant:

bool cmCPackLog::SetLogOutputFile(const char* fname)
{
  cmGeneratedFileStream *cg = 0;
  if ( fname )
    {
    cg = new cmGeneratedFileStream(fname);
    }
  if ( cg && !*cg )
    {
    delete cg;
    cg = 0;
    }
  this->SetLogOutputStream(cg);
  if ( !cg )
    {
    return false;
    }
  this->LogOutputCleanup = true;
  return true;
}